

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O3

EVP_PKEY_CTX * EVP_PKEY_CTX_new_id(int id,ENGINE *e)

{
  long lVar1;
  EVP_PKEY_CTX *pEVar2;
  
  lVar1 = 0;
  do {
    if ((*(EVP_PKEY_METHOD **)((long)evp_methods + lVar1))->pkey_id == id) {
      pEVar2 = evp_pkey_ctx_new((EVP_PKEY *)0x0,(ENGINE *)e,
                                *(EVP_PKEY_METHOD **)((long)evp_methods + lVar1));
      return (EVP_PKEY_CTX *)pEVar2;
    }
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x28);
  ERR_put_error(6,0,0x80,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                ,0x59);
  ERR_add_error_dataf("algorithm %d",id);
  return (EVP_PKEY_CTX *)0x0;
}

Assistant:

EVP_PKEY_CTX *EVP_PKEY_CTX_new_id(int id, ENGINE *e) {
  const EVP_PKEY_METHOD *pkey_method = evp_pkey_meth_find(id);
  if (pkey_method == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    ERR_add_error_dataf("algorithm %d", id);
    return NULL;
  }

  return evp_pkey_ctx_new(NULL, e, pkey_method);
}